

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O2

void __thiscall
HostVector_iterators_and_ranges_Test::TestBody(HostVector_iterators_and_ranges_Test *this)

{
  long lVar1;
  pointer pvVar2;
  char *pcVar3;
  float sum;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  HostVector<float> v1;
  
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
  ::Array<int,void>((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
                     *)&v1,100);
  for (pvVar2 = v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_;
      pvVar2 < v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_ +
               v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.size_; pvVar2 = pvVar2 + 1
      ) {
    *pvVar2 = 3.0;
  }
  for (lVar1 = 0; v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.size_ << 2 != lVar1;
      lVar1 = lVar1 + 4) {
    *(undefined4 *)
     ((long)v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_ + lVar1) =
         0x40400000;
  }
  sum = 0.0;
  for (lVar1 = 0; v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.size_ << 2 != lVar1;
      lVar1 = lVar1 + 4) {
    sum = sum + *(float *)((long)v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_
                          + lVar1);
  }
  local_48.ptr_._0_4_ = 0x43960000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"float(3*100)","sum",(float *)&local_48,&sum);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (lVar1 = 0; v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.size_ << 2 != lVar1;
      lVar1 = lVar1 + 4) {
    *(float *)((long)v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_ + lVar1) =
         *(float *)((long)v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_ +
                   lVar1) + 1.0;
  }
  sum = 0.0;
  for (lVar1 = 0; v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.size_ << 2 != lVar1;
      lVar1 = lVar1 + 4) {
    sum = sum + *(float *)((long)v1.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_
                          + lVar1);
  }
  local_48.ptr_._0_4_ = 0x43c80000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"float(4*100)","sum",(float *)&local_48,&sum);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  memory::
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array(&v1);
  return;
}

Assistant:

TEST(HostVector, iterators_and_ranges) {
    using namespace memory;

    // length constructor
    HostVector<float> v1(100);

    // check that begin()/end() iterators work
    for(auto it=v1.begin(); it<v1.end(); ++it)
        *it = float(3.0);

    // check that range based for loop works
    for(auto &val : v1)
        val = float(3.0);
    {
        float sum = 0;
        // check it works for const
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(3*100), sum);
    }

    // check that std::for_each works
    std::for_each(v1.begin(), v1.end(), [] (float& val) {val+=1;}); // add 1 to every value in v1
    {
        float sum = 0;
        for(auto val : v1)
            sum+=val;
        EXPECT_EQ(float(4*100), sum);
    }
}